

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O0

Message * __thiscall google::protobuf::DynamicMessage::New(DynamicMessage *this,Arena *arena)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Message *message;
  Arena *arena_local;
  DynamicMessage *this_local;
  
  if (arena == (Arena *)0x0) {
    iVar1 = (*(this->super_Message).super_MessageLite._vptr_MessageLite[3])();
    this_local = (DynamicMessage *)CONCAT44(extraout_var_00,iVar1);
  }
  else {
    iVar1 = (*(this->super_Message).super_MessageLite._vptr_MessageLite[3])();
    this_local = (DynamicMessage *)CONCAT44(extraout_var,iVar1);
    Arena::Own<google::protobuf::Message>(arena,(Message *)this_local);
  }
  return &this_local->super_Message;
}

Assistant:

Message* DynamicMessage::New(::google::protobuf::Arena* arena) const {
  if (arena != NULL) {
    Message* message = New();
    arena->Own(message);
    return message;
  } else {
    return New();
  }
}